

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O3

void __thiscall icu_63::UVector32::_init(UVector32 *this,int32_t initialCapacity,UErrorCode *status)

{
  int32_t y;
  int iVar1;
  int32_t iVar2;
  int32_t *piVar3;
  
  iVar1 = 8;
  if (0 < initialCapacity) {
    iVar1 = initialCapacity;
  }
  y = this->maxCapacity;
  iVar2 = iVar1;
  if (y < iVar1) {
    iVar2 = y;
  }
  if (y < 1) {
    iVar2 = iVar1;
  }
  if (0x1fffffff < iVar2) {
    iVar2 = uprv_min_63(8,y);
  }
  piVar3 = (int32_t *)uprv_malloc_63((long)iVar2 << 2);
  this->elements = piVar3;
  if (piVar3 == (int32_t *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    this->capacity = iVar2;
  }
  return;
}

Assistant:

void UVector32::_init(int32_t initialCapacity, UErrorCode &status) {
    // Fix bogus initialCapacity values; avoid malloc(0)
    if (initialCapacity < 1) {
        initialCapacity = DEFAULT_CAPACITY;
    }
    if (maxCapacity>0 && maxCapacity<initialCapacity) {
        initialCapacity = maxCapacity;
    }
    if (initialCapacity > (int32_t)(INT32_MAX / sizeof(int32_t))) {
        initialCapacity = uprv_min(DEFAULT_CAPACITY, maxCapacity);
    }
    elements = (int32_t *)uprv_malloc(sizeof(int32_t)*initialCapacity);
    if (elements == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
    } else {
        capacity = initialCapacity;
    }
}